

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_3dVector *
ON_TriangleNormal(ON_3dVector *__return_storage_ptr__,ON_3dPoint *A,ON_3dPoint *B,ON_3dPoint *C)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar7 = B->x;
  dVar9 = C->x;
  dVar10 = A->x;
  dVar11 = B->y;
  dVar2 = B->z;
  dVar3 = A->y;
  dVar4 = A->z;
  dVar5 = C->y;
  dVar6 = C->z;
  auVar8._0_8_ = (dVar4 - dVar2) * dVar5 + (dVar2 - dVar6) * dVar3 + (dVar6 - dVar4) * dVar11;
  auVar8._8_8_ = (dVar10 - dVar7) * dVar6 + (dVar7 - dVar9) * dVar4 + (dVar9 - dVar10) * dVar2;
  __return_storage_ptr__->x = auVar8._0_8_;
  __return_storage_ptr__->y = auVar8._8_8_;
  dVar7 = (dVar3 - dVar11) * dVar9 + (dVar11 - dVar5) * dVar10 + (dVar5 - dVar3) * dVar7;
  __return_storage_ptr__->z = dVar7;
  dVar10 = ABS(auVar8._0_8_);
  dVar11 = ABS(auVar8._8_8_);
  dVar9 = ABS(dVar7);
  if (dVar11 <= dVar10) {
    if (dVar9 <= dVar10) {
      dVar2 = dVar10;
      if (2.2250738585072014e-308 < dVar10) {
        dVar2 = SQRT((dVar9 / dVar10) * (dVar9 / dVar10) +
                     (dVar11 / dVar10) * (dVar11 / dVar10) + 1.0) * dVar10;
      }
      goto LAB_0050fb7d;
    }
  }
  else if (dVar9 <= dVar11) {
    dVar2 = dVar11;
    if (2.2250738585072014e-308 < dVar11) {
      dVar2 = SQRT((dVar10 / dVar11) * (dVar10 / dVar11) + (dVar9 / dVar11) * (dVar9 / dVar11) + 1.0
                  ) * dVar11;
    }
    goto LAB_0050fb7d;
  }
  dVar2 = dVar9;
  if (2.2250738585072014e-308 < dVar9) {
    dVar2 = SQRT((dVar11 / dVar9) * (dVar11 / dVar9) + (dVar10 / dVar9) * (dVar10 / dVar9) + 1.0) *
            dVar9;
  }
LAB_0050fb7d:
  if (0.0 < dVar2) {
    auVar1._8_4_ = SUB84(dVar2,0);
    auVar1._0_8_ = dVar2;
    auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
    auVar8 = divpd(auVar8,auVar1);
    __return_storage_ptr__->x = (double)auVar8._0_8_;
    __return_storage_ptr__->y = (double)auVar8._8_8_;
    __return_storage_ptr__->z = dVar7 / dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_TriangleNormal(
        const ON_3dPoint& A,
        const ON_3dPoint& B,
        const ON_3dPoint& C
        )
{
  // N = normal to triangle's plane
  ON_3dVector N;
  double a, b, c, d;
  N.x = A.y*(B.z-C.z) + B.y*(C.z-A.z) + C.y*(A.z-B.z);
  N.y = A.z*(B.x-C.x) + B.z*(C.x-A.x) + C.z*(A.x-B.x);
  N.z = A.x*(B.y-C.y) + B.x*(C.y-A.y) + C.x*(A.y-B.y);

  a = fabs(N.x);
  b = fabs(N.y);
  c = fabs(N.z);
  if ( b > a )
  {
    if ( c > b )
    {
      // c is largest
      if ( c > ON_DBL_MIN )
      {
        a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
      }
      else
      {
        d = c;
      }
    }
    else
    {
      if ( b > ON_DBL_MIN )
      {
        // b is largest
        a /= b; c /= b; d = b*sqrt(1.0 + c*c + a*a);
      }
      else
      {
        d = b;
      }
    }
  }
  else if ( c > a )
  {
    // c is largest
    if ( c > ON_DBL_MIN )
    {
      a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
    }
    else
    {
      d = c;
    }
  }
  else if ( a > ON_DBL_MIN )
  {
    // a is largest
    b /= a; c /= a; d = a*sqrt(1.0 + b*b + c*c);
  }
  else
  {
    d = a;
  }

  if ( d > 0.0 )
  {
    N.x /= d; N.y /= d; N.z /= d;
  }

  return N;
}